

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O0

void __thiscall
duckdb::ZSTDScanState::DecompressString
          (ZSTDScanState *this,ZSTDVectorScanState *scan_state,data_ptr_t destination,
          idx_t uncompressed_length)

{
  long lVar1;
  uint uVar2;
  undefined8 uVar3;
  long in_RCX;
  long in_RSI;
  ZSTDVectorScanState *in_stack_00000018;
  ZSTDScanState *in_stack_00000020;
  size_t res;
  idx_t old_pos;
  ZSTD_outBuffer out_buffer;
  ZSTD_inBuffer *in_stack_00000138;
  ZSTD_outBuffer *in_stack_00000140;
  ZSTD_DStream *in_stack_00000148;
  char *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  InvalidInputException *in_stack_ffffffffffffffa0;
  
  if (in_RCX != 0) {
    while( true ) {
      lVar1 = *(long *)(in_RSI + 0x78);
      duckdb_zstd::ZSTD_decompressStream(in_stack_00000148,in_stack_00000140,in_stack_00000138);
      *(long *)(in_RSI + 0x60) = (*(long *)(in_RSI + 0x78) - lVar1) + *(long *)(in_RSI + 0x60);
      uVar2 = duckdb_zstd::ZSTD_isError(0xa3784a);
      if (uVar2 != 0) {
        uVar3 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff98,"ZSTD Decompression failed: %s",
                   (allocator *)&stack0xffffffffffffff97);
        duckdb_zstd::ZSTD_getErrorName(0xa37898);
        InvalidInputException::InvalidInputException<char_const*>
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        __cxa_throw(uVar3,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      if (in_RCX == 0) break;
      LoadNextPageForVector(in_stack_00000020,in_stack_00000018);
    }
  }
  return;
}

Assistant:

void DecompressString(ZSTDVectorScanState &scan_state, data_ptr_t destination, idx_t uncompressed_length) {
		if (uncompressed_length == 0) {
			return;
		}

		duckdb_zstd::ZSTD_outBuffer out_buffer;

		out_buffer.dst = destination;
		out_buffer.pos = 0;
		out_buffer.size = uncompressed_length;

		while (true) {
			idx_t old_pos = scan_state.in_buffer.pos;
			size_t res = duckdb_zstd::ZSTD_decompressStream(
			    /* zds = */ decompression_context,
			    /* output =*/&out_buffer,
			    /* input =*/&scan_state.in_buffer);
			scan_state.compressed_scan_count += scan_state.in_buffer.pos - old_pos;
			if (duckdb_zstd::ZSTD_isError(res)) {
				throw InvalidInputException("ZSTD Decompression failed: %s", duckdb_zstd::ZSTD_getErrorName(res));
			}
			if (out_buffer.pos == out_buffer.size) {
				break;
			}
			// Did not fully decompress, it needs a new page to read from
			LoadNextPageForVector(scan_state);
		}
	}